

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArray.h
# Opt level: O3

void __thiscall
pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>>::
pushBack<pica::Particle<(pica::Dimension)1>>
          (ParticleArraySoA<pica::Particle<(pica::Dimension)1>> *this,
          Particle<(pica::Dimension)1> particle)

{
  iterator iVar1;
  iterator __position;
  int d;
  long lVar2;
  ParticleArraySoA<pica::Particle<(pica::Dimension)1>> *this_00;
  double local_50;
  double local_48 [4];
  
  local_48[0] = particle.position.x;
  iVar1._M_current = *(double **)(this + 8);
  if (iVar1._M_current == *(double **)(this + 0x10)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)this,iVar1,local_48);
  }
  else {
    *iVar1._M_current = particle.position.x;
    *(double **)(this + 8) = iVar1._M_current + 1;
  }
  local_48[2] = particle.p.z;
  local_48[0] = particle.p.x;
  local_48[1] = particle.p.y;
  this_00 = this + 0x18;
  lVar2 = 0;
  do {
    local_50 = local_48[lVar2];
    iVar1._M_current = *(double **)(this_00 + 8);
    if (iVar1._M_current == *(double **)(this_00 + 0x10)) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                ((vector<double,_std::allocator<double>_> *)this_00,iVar1,&local_50);
    }
    else {
      *iVar1._M_current = local_50;
      *(double **)(this_00 + 8) = iVar1._M_current + 1;
    }
    lVar2 = lVar2 + 1;
    this_00 = this_00 + 0x18;
  } while (lVar2 != 3);
  local_50 = particle.factor;
  iVar1._M_current = *(double **)(this + 0x68);
  if (iVar1._M_current == *(double **)(this + 0x70)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)(this + 0x60),iVar1,&local_50);
  }
  else {
    *iVar1._M_current = particle.factor;
    *(double **)(this + 0x68) = iVar1._M_current + 1;
  }
  local_50 = 1.0 / (1.0 / particle.invGamma);
  iVar1._M_current = *(double **)(this + 0x80);
  if (iVar1._M_current == *(double **)(this + 0x88)) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
              ((vector<double,_std::allocator<double>_> *)(this + 0x78),iVar1,&local_50);
  }
  else {
    *iVar1._M_current = local_50;
    *(double **)(this + 0x80) = iVar1._M_current + 1;
  }
  local_50 = (double)CONCAT62(local_50._2_6_,particle.typeIndex);
  __position._M_current = *(short **)(this + 0x98);
  if (__position._M_current == *(short **)(this + 0xa0)) {
    std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
              ((vector<short,_std::allocator<short>_> *)(this + 0x90),__position,(short *)&local_50)
    ;
  }
  else {
    *__position._M_current = particle.typeIndex;
    *(short **)(this + 0x98) = __position._M_current + 1;
  }
  return;
}

Assistant:

void pushBack(ConstParticleRefType particle)
    {
        const typename ParticleRef::PositionType position = particle.getPosition();
        for (int d = 0; d < ParticleRef::dimension; d++)
            positions[d].push_back(position[d]);
        const typename ParticleRef::MomentumType p = particle.getP();
        for (int d = 0; d < ParticleRef::momentumDimension; d++)
            ps[d].push_back(p[d]);
        factors.push_back(particle.getFactor());
        invGammas.push_back(static_cast<typename ParticleRef::GammaType>(1.0) / particle.getGamma());
        typeIndex.push_back(particle.getType());
    }